

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::none_observer>
::is_timelimit_reached
          (solver_functor<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::none_observer>
           *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar5 [16];
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = lVar3;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->m_ctx->parameters).time_limit;
  auVar5._0_8_ = (double)(lVar3 - (this->m_begin).__d.__r) / 1000000000.0;
  auVar5._8_8_ = extraout_XMM1_Qb;
  uVar1 = vcmppd_avx512vl(auVar4,ZEXT816(0) << 0x40,6);
  uVar2 = vcmppd_avx512vl(auVar4,auVar5,1);
  return (bool)((byte)uVar1 & 3 & (byte)uVar2 & 1);
}

Assistant:

bool is_timelimit_reached()
    {
        m_end = std::chrono::steady_clock::now();

        return is_time_limit(m_ctx.parameters.time_limit, m_begin, m_end);
    }